

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_simulate.c
# Opt level: O0

void picnic3_mpc_sbox_s256_lowmc_255_255_4(mzd_local_t *statein,randomTape_t *tapes,msgs_t *msgs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  word256 v;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  long in_RDX;
  long in_RSI;
  undefined1 (*in_RDI) [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  word256 and_helper_ca;
  word256 and_helper_bc;
  word256 and_helper_ab;
  word256 mask_c;
  word256 mask_b;
  word256 mask_a;
  bitstream_t party_tape;
  bitstream_t party_msgs;
  int i;
  word256 t2;
  word256 t1;
  word256 t0;
  word256 s_ab;
  word256 s_ca;
  word256 s_bc;
  word256 c;
  word256 b;
  word256 a;
  word256 tmp;
  word256 bitm_c;
  word256 bitm_b;
  word256 bitm_a;
  ulong local_1780;
  ulong uStackY_1778;
  ulong uStackY_1770;
  ulong uStackY_1768;
  ulong local_1760;
  size_t in_stack_ffffffffffffe8a8;
  size_t in_stack_ffffffffffffe8b0;
  bitstream_t *in_stack_ffffffffffffe8b8;
  ulong uStack_1728;
  int local_1684;
  ulong local_1680;
  ulong uStack_1678;
  ulong uStack_1670;
  ulong uStack_1668;
  undefined1 local_1660 [16];
  ulong uStack_1650;
  ulong uStack_1648;
  undefined1 local_1640 [16];
  ulong uStack_1630;
  ulong uStack_1628;
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  ulong local_15c0;
  ulong uStack_15b8;
  ulong uStack_15b0;
  ulong uStack_15a8;
  ulong local_15a0;
  ulong uStack_1598;
  ulong uStack_1590;
  ulong uStack_1588;
  ulong local_1580;
  ulong uStack_1578;
  ulong uStack_1570;
  ulong uStack_1568;
  undefined1 local_1560 [32];
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  ulong local_3e0;
  ulong uStack_3d8;
  ulong uStack_3d0;
  ulong uStack_3c8;
  ulong local_320;
  ulong uStack_318;
  ulong uStack_310;
  ulong uStack_308;
  ulong local_300;
  ulong uStack_2f8;
  ulong uStack_2f0;
  ulong uStack_2e8;
  ulong local_2e0;
  ulong uStack_2d8;
  ulong uStack_2d0;
  ulong uStack_2c8;
  ulong local_220;
  ulong uStack_218;
  ulong uStack_210;
  ulong uStack_208;
  ulong local_200;
  ulong uStack_1f8;
  ulong uStack_1f0;
  ulong uStack_1e8;
  ulong local_160;
  ulong uStack_158;
  ulong uStack_150;
  ulong uStack_148;
  ulong local_140;
  ulong uStack_138;
  ulong uStack_130;
  ulong uStack_128;
  
  auVar1 = vpunpcklqdq_avx(ZEXT816(0x2492492492492492),ZEXT816(0x9249249249249249));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x4924924924924924),ZEXT816(0x2492492492492492));
  uStack_1430 = auVar2._0_8_;
  uStack_1428 = auVar2._8_8_;
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x4924924924924924),ZEXT816(0x2492492492492492));
  auVar3 = vpunpcklqdq_avx(ZEXT816(0x9249249249249249),ZEXT816(0x4924924924924924));
  uStack_1470 = auVar3._0_8_;
  uStack_1468 = auVar3._8_8_;
  auVar3 = vpunpcklqdq_avx(ZEXT816(0x9249249249249248),ZEXT816(0x4924924924924924));
  auVar4 = vpunpcklqdq_avx(ZEXT816(0x2492492492492492),ZEXT816(0x9249249249249249));
  uStack_14b0 = auVar4._0_8_;
  uStack_14a8 = auVar4._8_8_;
  auVar5._16_8_ = uStack_1430;
  auVar5._0_16_ = auVar1;
  auVar5._24_8_ = uStack_1428;
  auVar5 = vpand_avx2(auVar5,*in_RDI);
  auVar6._16_8_ = uStack_1470;
  auVar6._0_16_ = auVar2;
  auVar6._24_8_ = uStack_1468;
  auVar6 = vpand_avx2(auVar6,*in_RDI);
  auVar7._16_8_ = uStack_14b0;
  auVar7._0_16_ = auVar3;
  auVar7._24_8_ = uStack_14a8;
  auVar7 = vpand_avx2(auVar7,*in_RDI);
  auVar28 = vpsllq_avx2(auVar5,ZEXT416(2));
  auVar5 = vpsrlq_avx2(auVar5,ZEXT416(0x3e));
  auVar5 = vpermq_avx2(auVar5,0x93);
  auVar5 = vpor_avx2(auVar28,auVar5);
  auVar28 = vpsllq_avx2(auVar6,ZEXT416(1));
  auVar6 = vpsrlq_avx2(auVar6,ZEXT416(0x3f));
  auVar6 = vpermq_avx2(auVar6,0x93);
  auVar6 = vpor_avx2(auVar28,auVar6);
  local_15a0 = auVar6._0_8_;
  uStack_1598 = auVar6._8_8_;
  uStack_1590 = auVar6._16_8_;
  uStack_1588 = auVar6._24_8_;
  local_15c0 = auVar7._0_8_;
  uStack_15b8 = auVar7._8_8_;
  uStack_15b0 = auVar7._16_8_;
  uStack_15a8 = auVar7._24_8_;
  local_15e0 = vpand_avx2(auVar6,auVar7);
  local_1580 = auVar5._0_8_;
  uStack_1578 = auVar5._8_8_;
  uStack_1570 = auVar5._16_8_;
  uStack_1568 = auVar5._24_8_;
  local_1600 = vpand_avx2(auVar7,auVar5);
  local_1620 = vpand_avx2(auVar5,auVar6);
  auVar30 = ZEXT3264(local_1620);
  for (local_1684 = 0; auVar28 = auVar30._0_32_, local_1684 < 0x10; local_1684 = local_1684 + 1) {
    if (local_1684 == *(int *)(in_RDX + 0x88)) {
      w256_from_bitstream(in_stack_ffffffffffffe8b8,in_stack_ffffffffffffe8b0,
                          in_stack_ffffffffffffe8a8);
      auVar23._16_8_ = uStack_1430;
      auVar23._0_16_ = auVar1;
      auVar23._24_8_ = uStack_1428;
      auVar8 = vpand_avx2(auVar23,auVar28);
      auVar22._16_8_ = uStack_1470;
      auVar22._0_16_ = auVar2;
      auVar22._24_8_ = uStack_1468;
      auVar9 = vpand_avx2(auVar22,auVar28);
      auVar21._16_8_ = uStack_14b0;
      auVar21._0_16_ = auVar3;
      auVar21._24_8_ = uStack_14a8;
      auVar28 = vpand_avx2(auVar21,auVar28);
      auVar29 = vpsllq_avx2(auVar8,ZEXT416(2));
      auVar8 = vpsrlq_avx2(auVar8,ZEXT416(0x3e));
      auVar8 = vpermq_avx2(auVar8,0x93);
      auVar8 = vpor_avx2(auVar29,auVar8);
      auVar29 = vpsllq_avx2(auVar9,ZEXT416(1));
      auVar9 = vpsrlq_avx2(auVar9,ZEXT416(0x3f));
      auVar9 = vpermq_avx2(auVar9,0x93);
      auVar9 = vpor_avx2(auVar29,auVar9);
      local_1680 = auVar28._0_8_;
      uStack_1678 = auVar28._8_8_;
      uStack_1670 = auVar28._16_8_;
      uStack_1668 = auVar28._24_8_;
      local_1620._8_8_ = uStack_1678 ^ local_1620._8_8_;
      local_1620._0_8_ = local_1680 ^ local_1620._0_8_;
      local_1620._16_8_ = uStack_1670 ^ local_1620._16_8_;
      local_1620._24_8_ = uStack_1668 ^ local_1620._24_8_;
      local_1660._0_8_ = auVar9._0_8_;
      local_1660._8_8_ = auVar9._8_8_;
      uStack_1650 = auVar9._16_8_;
      uStack_1648 = auVar9._24_8_;
      local_15e0._8_8_ = local_1660._8_8_ ^ local_15e0._8_8_;
      local_15e0._0_8_ = local_1660._0_8_ ^ local_15e0._0_8_;
      local_15e0._16_8_ = uStack_1650 ^ local_15e0._16_8_;
      local_15e0._24_8_ = uStack_1648 ^ local_15e0._24_8_;
      local_1600 = auVar8 ^ local_1600;
      auVar30 = ZEXT3264(local_1600);
    }
    else {
      w256_from_bitstream(in_stack_ffffffffffffe8b8,in_stack_ffffffffffffe8b0,
                          in_stack_ffffffffffffe8a8);
      auVar20._16_8_ = uStack_1430;
      auVar20._0_16_ = auVar1;
      auVar20._24_8_ = uStack_1428;
      auVar8 = vpand_avx2(auVar20,auVar28);
      auVar11._16_8_ = uStack_1470;
      auVar11._0_16_ = auVar2;
      auVar11._24_8_ = uStack_1468;
      auVar9 = vpand_avx2(auVar11,auVar28);
      auVar10._16_8_ = uStack_14b0;
      auVar10._0_16_ = auVar3;
      auVar10._24_8_ = uStack_14a8;
      auVar28 = vpand_avx2(auVar10,auVar28);
      auVar29 = vpsllq_avx2(auVar8,ZEXT416(2));
      auVar8 = vpsrlq_avx2(auVar8,ZEXT416(0x3e));
      auVar8 = vpermq_avx2(auVar8,0x93);
      auVar10 = vpor_avx2(auVar29,auVar8);
      auVar8 = vpsllq_avx2(auVar9,ZEXT416(1));
      auVar9 = vpsrlq_avx2(auVar9,ZEXT416(0x3f));
      auVar9 = vpermq_avx2(auVar9,0x93);
      auVar11 = vpor_avx2(auVar8,auVar9);
      auVar29 = auVar11;
      w256_from_bitstream(in_stack_ffffffffffffe8b8,in_stack_ffffffffffffe8b0,
                          in_stack_ffffffffffffe8a8);
      auVar19._16_8_ = uStack_14b0;
      auVar19._0_16_ = auVar3;
      auVar19._24_8_ = uStack_14a8;
      auVar8 = vpand_avx2(auVar19,auVar29);
      uStack_1728 = auVar8._24_8_;
      auVar18._16_8_ = uStack_1470;
      auVar18._0_16_ = auVar2;
      auVar18._24_8_ = uStack_1468;
      auVar9 = vpand_avx2(auVar18,auVar29);
      auVar12._16_8_ = uStack_1430;
      auVar12._0_16_ = auVar1;
      auVar12._24_8_ = uStack_1428;
      auVar29 = vpand_avx2(auVar12,auVar29);
      auVar12 = vpsllq_avx2(auVar29,ZEXT416(2));
      auVar29 = vpsrlq_avx2(auVar29,ZEXT416(0x3e));
      auVar29 = vpermq_avx2(auVar29,0x93);
      auVar12 = vpor_avx2(auVar12,auVar29);
      auVar29 = vpsllq_avx2(auVar9,ZEXT416(1));
      auVar9 = vpsrlq_avx2(auVar9,ZEXT416(0x3f));
      auVar9 = vpermq_avx2(auVar9,0x93);
      auVar9 = vpor_avx2(auVar29,auVar9);
      local_1760 = auVar9._0_8_;
      in_stack_ffffffffffffe8a8 = auVar9._8_8_;
      in_stack_ffffffffffffe8b0 = auVar9._16_8_;
      in_stack_ffffffffffffe8b8 = auVar9._24_8_;
      auVar9 = vpand_avx2(auVar5,auVar11);
      auVar29 = vpand_avx2(auVar6,auVar10);
      local_140 = auVar9._0_8_;
      uStack_138 = auVar9._8_8_;
      uStack_130 = auVar9._16_8_;
      uStack_128 = auVar9._24_8_;
      local_160 = auVar29._0_8_;
      uStack_158 = auVar29._8_8_;
      uStack_150 = auVar29._16_8_;
      uStack_148 = auVar29._24_8_;
      uVar13 = local_140 ^ local_160 ^ auVar8._0_8_;
      uVar14 = uStack_138 ^ uStack_158 ^ auVar8._8_8_;
      uVar15 = uStack_130 ^ uStack_150 ^ auVar8._16_8_;
      uStack_1728 = uStack_128 ^ uStack_148 ^ uStack_1728;
      local_1620._8_8_ = uVar14 ^ local_1620._8_8_;
      local_1620._0_8_ = uVar13 ^ local_1620._0_8_;
      local_1620._16_8_ = uVar15 ^ local_1620._16_8_;
      local_1620._24_8_ = uStack_1728 ^ local_1620._24_8_;
      auVar9 = vpand_avx2(auVar6,auVar28);
      auVar29 = vpand_avx2(auVar7,auVar11);
      local_200 = auVar9._0_8_;
      uStack_1f8 = auVar9._8_8_;
      uStack_1f0 = auVar9._16_8_;
      uStack_1e8 = auVar9._24_8_;
      local_220 = auVar29._0_8_;
      uStack_218 = auVar29._8_8_;
      uStack_210 = auVar29._16_8_;
      uStack_208 = auVar29._24_8_;
      local_1640._0_8_ = local_200 ^ local_220 ^ local_1760;
      local_1640._8_8_ = uStack_1f8 ^ uStack_218 ^ in_stack_ffffffffffffe8a8;
      uVar16 = uStack_1f0 ^ uStack_210 ^ in_stack_ffffffffffffe8b0;
      uVar17 = uStack_1e8 ^ uStack_208 ^ (ulong)in_stack_ffffffffffffe8b8;
      local_15e0._8_8_ = local_1640._8_8_ ^ local_15e0._8_8_;
      local_15e0._0_8_ = local_1640._0_8_ ^ local_15e0._0_8_;
      local_15e0._16_8_ = uVar16 ^ local_15e0._16_8_;
      local_15e0._24_8_ = uVar17 ^ local_15e0._24_8_;
      auVar27._16_8_ = uVar16;
      auVar27._0_16_ = local_1640;
      auVar27._24_8_ = uVar17;
      auVar29 = vpsrlq_avx2(auVar27,ZEXT416(1));
      auVar25._16_8_ = uVar16;
      auVar25._0_16_ = local_1640;
      auVar25._24_8_ = uVar17;
      auVar9 = vpsllq_avx2(auVar25,ZEXT416(0x3f));
      auVar9 = vpermq_avx2(auVar9,0x39);
      auVar9 = vpor_avx2(auVar29,auVar9);
      local_2e0 = auVar9._0_8_;
      uStack_2d8 = auVar9._8_8_;
      uStack_2d0 = auVar9._16_8_;
      uStack_2c8 = auVar9._24_8_;
      auVar9 = vpand_avx2(auVar7,auVar10);
      auVar29 = vpand_avx2(auVar5,auVar28);
      local_300 = auVar9._0_8_;
      uStack_2f8 = auVar9._8_8_;
      uStack_2f0 = auVar9._16_8_;
      uStack_2e8 = auVar9._24_8_;
      local_320 = auVar29._0_8_;
      uStack_318 = auVar29._8_8_;
      uStack_310 = auVar29._16_8_;
      uStack_308 = auVar29._24_8_;
      local_1780 = auVar12._0_8_;
      uStackY_1778 = auVar12._8_8_;
      uStackY_1770 = auVar12._16_8_;
      uStackY_1768 = auVar12._24_8_;
      local_1640._0_8_ = local_300 ^ local_320 ^ local_1780;
      local_1640._8_8_ = uStack_2f8 ^ uStack_318 ^ uStackY_1778;
      uStackY_1770 = uStack_2f0 ^ uStack_310 ^ uStackY_1770;
      uStackY_1768 = uStack_2e8 ^ uStack_308 ^ uStackY_1768;
      local_1600._8_8_ = local_1640._8_8_ ^ local_1600._8_8_;
      local_1600._0_8_ = local_1640._0_8_ ^ local_1600._0_8_;
      local_1600._16_8_ = uStackY_1770 ^ local_1600._16_8_;
      local_1600._24_8_ = uStackY_1768 ^ local_1600._24_8_;
      auVar26._16_8_ = uStackY_1770;
      auVar26._0_16_ = local_1640;
      auVar26._24_8_ = uStackY_1768;
      auVar29 = vpsrlq_avx2(auVar26,ZEXT416(2));
      auVar24._16_8_ = uStackY_1770;
      auVar24._0_16_ = local_1640;
      auVar24._24_8_ = uStackY_1768;
      auVar9 = vpsllq_avx2(auVar24,ZEXT416(0x3e));
      auVar9 = vpermq_avx2(auVar9,0x39);
      auVar9 = vpor_avx2(auVar29,auVar9);
      local_3e0 = auVar9._0_8_;
      uStack_3d8 = auVar9._8_8_;
      uStack_3d0 = auVar9._16_8_;
      uStack_3c8 = auVar9._24_8_;
      local_1560 = CONCAT824(uStack_1728 ^ uStack_2c8 ^ uStack_3c8,
                             CONCAT816(uVar15 ^ uStack_2d0 ^ uStack_3d0,
                                       CONCAT88(uVar14 ^ uStack_2d8 ^ uStack_3d8,
                                                uVar13 ^ local_2e0 ^ local_3e0)));
      auVar30 = ZEXT3264(local_1560);
      v[1] = auVar8._0_8_;
      v[0] = (longlong)in_stack_ffffffffffffe8b8;
      v[2] = auVar8._8_8_;
      v[3] = auVar8._16_8_;
      w256_to_bitstream(auVar28._16_8_,v,in_stack_ffffffffffffe8b0,in_stack_ffffffffffffe8a8);
    }
  }
  *(int *)(in_RSI + 0x90) = *(int *)(in_RSI + 0x90) + 0xff;
  *(int *)(in_RSI + 0x90) = *(int *)(in_RSI + 0x90) + 0xff;
  *(long *)(in_RDX + 0x80) = *(long *)(in_RDX + 0x80) + 0xff;
  local_1640._8_8_ = local_15e0._8_8_ ^ uStack_1578;
  local_1640._0_8_ = local_15e0._0_8_ ^ local_1580;
  uVar13 = local_1600._16_8_ ^ uStack_1570 ^ uStack_1590;
  uVar14 = local_1600._24_8_ ^ uStack_1568 ^ uStack_1588;
  local_1660._8_8_ = local_1600._8_8_ ^ uStack_1578 ^ uStack_1598;
  local_1660._0_8_ = local_1600._0_8_ ^ local_1580 ^ local_15a0;
  auVar29._16_8_ = local_15e0._16_8_ ^ uStack_1570;
  auVar29._0_16_ = local_1640;
  auVar29._24_8_ = local_15e0._24_8_ ^ uStack_1568;
  auVar6 = vpsrlq_avx2(auVar29,ZEXT416(2));
  auVar8._16_8_ = local_15e0._16_8_ ^ uStack_1570;
  auVar8._0_16_ = local_1640;
  auVar8._24_8_ = local_15e0._24_8_ ^ uStack_1568;
  auVar5 = vpsllq_avx2(auVar8,ZEXT416(0x3e));
  auVar5 = vpermq_avx2(auVar5,0x39);
  auVar5 = vpor_avx2(auVar6,auVar5);
  auVar9._16_8_ = uVar13;
  auVar9._0_16_ = local_1660;
  auVar9._24_8_ = uVar14;
  auVar7 = vpsrlq_avx2(auVar9,ZEXT416(1));
  auVar28._16_8_ = uVar13;
  auVar28._0_16_ = local_1660;
  auVar28._24_8_ = uVar14;
  auVar6 = vpsllq_avx2(auVar28,ZEXT416(0x3f));
  auVar6 = vpermq_avx2(auVar6,0x39);
  auVar6 = vpor_avx2(auVar7,auVar6);
  local_1660._0_8_ = auVar6._0_8_;
  local_1660._8_8_ = auVar6._8_8_;
  uStack_1650 = auVar6._16_8_;
  uStack_1648 = auVar6._24_8_;
  local_1640._0_8_ = auVar5._0_8_;
  local_1640._8_8_ = auVar5._8_8_;
  uStack_1630 = auVar5._16_8_;
  uStack_1628 = auVar5._24_8_;
  *(ulong *)*in_RDI =
       local_1620._0_8_ ^ local_1580 ^ local_15a0 ^ local_15c0 ^ local_1660._0_8_ ^ local_1640._0_8_
  ;
  *(ulong *)(*in_RDI + 8) =
       local_1620._8_8_ ^ uStack_1578 ^ uStack_1598 ^ uStack_15b8 ^ local_1660._8_8_ ^
       local_1640._8_8_;
  *(ulong *)(*in_RDI + 0x10) =
       local_1620._16_8_ ^ uStack_1570 ^ uStack_1590 ^ uStack_15b0 ^ uStack_1650 ^ uStack_1630;
  *(ulong *)(*in_RDI + 0x18) =
       local_1620._24_8_ ^ uStack_1568 ^ uStack_1588 ^ uStack_15a8 ^ uStack_1648 ^ uStack_1628;
  return;
}

Assistant:

ATTR_TARGET_AVX2
static void picnic3_mpc_sbox_s256_lowmc_255_255_4(mzd_local_t* statein, randomTape_t* tapes,
                                                  msgs_t* msgs) {
  picnic3_mpc_sbox_bitsliced_mm256(LOWMC_255_255_4_N,
                                   mm256_set_4(MASK_255_255_85_A_0, MASK_255_255_85_A_1,
                                               MASK_255_255_85_A_2, MASK_255_255_85_A_3),
                                   mm256_set_4(MASK_255_255_85_B_0, MASK_255_255_85_B_1,
                                               MASK_255_255_85_B_2, MASK_255_255_85_B_3),
                                   mm256_set_4(MASK_255_255_85_C_0, MASK_255_255_85_C_1,
                                               MASK_255_255_85_C_2, MASK_255_255_85_C_3));
}